

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegenTest.cpp
# Opt level: O2

void __thiscall
TestRegenerateCmakeAddTarget_LibraryAlias::Run(TestRegenerateCmakeAddTarget_LibraryAlias *this)

{
  __type _Var1;
  runtime_error *this_00;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_63a;
  allocator local_639;
  string expectedOutput;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  ostringstream oss;
  string local_5c0 [32];
  string local_5a0 [312];
  Configuration config;
  Component comp;
  
  boost::filesystem::path::path((path *)&config,"./MyComponent/");
  Component::Component(&comp,(path *)&config);
  std::__cxx11::string::~string((string *)&config);
  std::__cxx11::string::assign((char *)&comp.type);
  std::__cxx11::string::assign((char *)&comp.additionalTargetParameters);
  Configuration::Configuration(&config);
  std::__cxx11::string::string((string *)&oss,"add_library_alias",(allocator *)&expectedOutput);
  std::__detail::
  _Insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
  ::insert((_Insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
            *)&config.addLibraryAliases,(value_type *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::string((string *)&oss,"Analysis.cpp",(allocator *)&expectedOutput);
  std::__cxx11::string::string(local_5c0,"Analysis.h",(allocator *)&local_600);
  std::__cxx11::string::string(local_5a0,"main.cpp",&local_639);
  __l._M_len = 3;
  __l._M_array = (iterator)&oss;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(&files,__l,&local_63a);
  lVar2 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(&oss + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  std::__cxx11::string::string
            ((string *)&expectedOutput,
             "add_library_alias(${PROJECT_NAME} STATIC\n  Analysis.cpp\n  Analysis.h\n  main.cpp\n  EXCLUDE_FROM_ALL\n)\n\n"
             ,(allocator *)&oss);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  RegenerateCmakeAddTarget((ostream *)&oss,&config,&comp,&files,false);
  std::__cxx11::stringbuf::str();
  _Var1 = std::operator==(&local_600,&expectedOutput);
  std::__cxx11::string::~string((string *)&local_600);
  if (_Var1) {
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    std::__cxx11::string::~string((string *)&expectedOutput);
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&files.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
    Configuration::~Configuration(&config);
    Component::~Component(&comp);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Assertion failed: oss.str() == expectedOutput");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TEST(RegenerateCmakeAddTarget_LibraryAlias) {
  Component comp("./MyComponent/");
  comp.type = "add_library_alias";
  comp.additionalTargetParameters = "  EXCLUDE_FROM_ALL\n";

  Configuration config;
  config.addLibraryAliases.insert("add_library_alias");

  bool isHeaderOnly = false;

  const std::list<std::string> files{
    "Analysis.cpp",
    "Analysis.h",
    "main.cpp"
  };

  const std::string expectedOutput(
      "add_library_alias(${PROJECT_NAME} STATIC\n"
      "  Analysis.cpp\n"
      "  Analysis.h\n"
      "  main.cpp\n"
      "  EXCLUDE_FROM_ALL\n"
      ")\n"
      "\n");

  std::ostringstream oss;
  RegenerateCmakeAddTarget(oss, config, comp, files, isHeaderOnly);

  ASSERT(oss.str() == expectedOutput);
}